

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O2

void __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::NNLS
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,MatrixType *A,int max_iter,
          Scalar eps)

{
  Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>
  local_70;
  MatrixAtAType *local_60;
  non_const_type local_58;
  RowVectorType *local_50;
  RowVectorType *local_48;
  RowVectorType *local_40;
  MatrixType *local_38;
  
  local_70.m_rhs = local_70.m_lhs.m_matrix;
  this->_max_iter = max_iter;
  this->_num_ls = 0;
  this->_epsilon = eps;
  DenseStorage<float,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<float,__1,__1,__1,_0> *)&this->_A,(DenseStorage<float,__1,__1,__1,_0> *)A
            );
  local_60 = &this->_AtA;
  local_58 = (non_const_type)
             (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
  local_38 = &this->_A;
  local_70.m_lhs.m_matrix = local_58;
  Matrix<float,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<float,_1,_1,0,_1,_1> *)local_60,(long *)&local_70,(long *)&local_58);
  local_70.m_lhs.m_matrix =
       (non_const_type)
       (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->_x,(long *)&local_70);
  local_70.m_lhs.m_matrix =
       (non_const_type)
       (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_40 = &this->_x;
  Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->_w,(long *)&local_70);
  local_70.m_lhs.m_matrix =
       (non_const_type)
       (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_48 = &this->_w;
  Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->_y,(long *)&local_70);
  (this->_Atb).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)0x0;
  (this->_Atb).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_50 = &this->_y;
  PermutationMatrix<-1,_-1,_long>::PermutationMatrix
            (&this->_P,
             (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols);
  local_70.m_lhs.m_matrix =
       (non_const_type)
       (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_58 = (non_const_type)
             (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
  Matrix<float,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<float,_1,_1,0,_1,_1> *)&this->_QR,(long *)&local_70,(long *)&local_58);
  local_70.m_lhs.m_matrix =
       (non_const_type)
       (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->_qrCoeffs,(long *)&local_70);
  local_70.m_lhs.m_matrix =
       (non_const_type)
       (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->_tempVector,(long *)&local_70);
  local_58 = A;
  local_70 = MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>>::operator*
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>> *)
                        &local_58,(MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)A);
  internal::
  call_assignment<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
            (local_60,&local_70);
  return;
}

Assistant:

NNLS(const MatrixType &A, int max_iter=-1, Scalar eps=1e-10)
    : _max_iter(max_iter), _num_ls(0), _epsilon(eps),
      _A(A), _AtA(_A.cols(), _A.cols()),
      _x(_A.cols()), _w(_A.cols()), _y(_A.cols()),
      _P(_A.cols()), _QR(_A.rows(), _A.cols()), _qrCoeffs(_A.cols()), _tempVector(_A.cols())
  {
    // Ensure Scalar type is real.
    EIGEN_STATIC_ASSERT(!NumTraits<Scalar>::IsComplex, NUMERIC_TYPE_MUST_BE_REAL);

    // Precompute A^T*A
    _AtA = A.transpose() * A;
  }